

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_input_set_witness(wally_tx_input *input,wally_tx_witness_stack *stack)

{
  _Bool _Var1;
  int iVar2;
  wally_tx_witness_stack *local_28;
  wally_tx_witness_stack *new_witness;
  wally_tx_witness_stack *stack_local;
  wally_tx_input *input_local;
  
  local_28 = (wally_tx_witness_stack *)0x0;
  new_witness = stack;
  stack_local = (wally_tx_witness_stack *)input;
  _Var1 = is_valid_tx_input(input);
  if ((_Var1) &&
     ((new_witness == (wally_tx_witness_stack *)0x0 ||
      (_Var1 = is_valid_witness_stack(new_witness), _Var1)))) {
    if ((new_witness == (wally_tx_witness_stack *)0x0) ||
       (iVar2 = wally_tx_witness_stack_clone_alloc(new_witness,&local_28), iVar2 == 0)) {
      tx_witness_stack_free((wally_tx_witness_stack *)stack_local[2].num_items,true);
      stack_local[2].num_items = (size_t)local_28;
      input_local._4_4_ = 0;
    }
    else {
      input_local._4_4_ = -3;
    }
  }
  else {
    input_local._4_4_ = -2;
  }
  return input_local._4_4_;
}

Assistant:

int wally_tx_input_set_witness(struct wally_tx_input *input,
                               const struct wally_tx_witness_stack *stack)
{
    struct wally_tx_witness_stack *new_witness = NULL;

    if (!is_valid_tx_input(input) || (stack && !is_valid_witness_stack(stack)))
        return WALLY_EINVAL;

    if (stack &&
        wally_tx_witness_stack_clone_alloc(stack, &new_witness) != WALLY_OK)
        return WALLY_ENOMEM;

    tx_witness_stack_free(input->witness, true);
    input->witness = new_witness;
    return WALLY_OK;
}